

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLog>
               (GetterYs<unsigned_char> *getter,TransformerLinLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImPlotPlot *pIVar6;
  double dVar7;
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  int iVar10;
  int iVar11;
  ImPlotContext *gp;
  float fVar12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLinLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar8 = GImPlot;
  pIVar6 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar6->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar10 = getter->Count;
    local_48 = iVar10 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    dVar3 = getter->XScale;
    dVar4 = getter->X0;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar7 = log10((double)getter->Ys
                          [(long)((getter->Offset % iVar10 + iVar10) % iVar10) *
                           (long)getter->Stride] / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar5 = pIVar6->YAxis[iVar10].Range.Min;
    local_3c.x = (float)(((dVar3 * 0.0 + dVar4) - (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
                        (double)pIVar8->PixelRange[iVar10].Min.x);
    local_3c.y = (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar10]) *
                           (pIVar6->YAxis[iVar10].Range.Max - dVar5) + dVar5) - dVar5) *
                         pIVar8->My[iVar10] + (double)pIVar8->PixelRange[iVar10].Min.y);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterYs<unsigned_char>,ImPlot::TransformerLinLog>>
              ((LineStripRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::TransformerLinLog> *)
               local_58,local_60,&pIVar6->PlotRect);
  }
  else {
    dVar3 = getter->XScale;
    dVar4 = getter->X0;
    iVar10 = getter->Count;
    dVar7 = log10((double)getter->Ys
                          [(long)((getter->Offset % iVar10 + iVar10) % iVar10) *
                           (long)getter->Stride] / pIVar6->YAxis[transformer->YAxis].Range.Min);
    iVar10 = transformer->YAxis;
    pIVar6 = pIVar8->CurrentPlot;
    dVar5 = pIVar6->YAxis[iVar10].Range.Min;
    local_58._0_4_ =
         (undefined4)
         (((dVar3 * 0.0 + dVar4) - (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
         (double)pIVar8->PixelRange[iVar10].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar7 / pIVar8->LogDenY[iVar10]) *
                   (pIVar6->YAxis[iVar10].Range.Max - dVar5) + dVar5) - dVar5) * pIVar8->My[iVar10]
                + (double)pIVar8->PixelRange[iVar10].Min.y);
    iVar10 = getter->Count;
    if (1 < iVar10) {
      iVar11 = 1;
      do {
        pIVar9 = GImPlot;
        dVar3 = getter->XScale;
        dVar4 = getter->X0;
        dVar7 = log10((double)getter->Ys
                              [(long)(((getter->Offset + iVar11) % iVar10 + iVar10) % iVar10) *
                               (long)getter->Stride] /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        iVar10 = transformer->YAxis;
        pIVar6 = pIVar9->CurrentPlot;
        dVar5 = pIVar6->YAxis[iVar10].Range.Min;
        local_68.x = (float)((((double)iVar11 * dVar3 + dVar4) - (pIVar6->XAxis).Range.Min) *
                             pIVar9->Mx + (double)pIVar9->PixelRange[iVar10].Min.x);
        fVar12 = (float)((((double)(float)(dVar7 / pIVar9->LogDenY[iVar10]) *
                           (pIVar6->YAxis[iVar10].Range.Max - dVar5) + dVar5) - dVar5) *
                         pIVar9->My[iVar10] + (double)pIVar9->PixelRange[iVar10].Min.y);
        local_68.y = fVar12;
        pIVar6 = pIVar8->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar12 <= (float)local_58._4_4_) {
          fVar2 = fVar12;
        }
        if ((fVar2 < (pIVar6->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar12 <= (float)local_58._4_4_) & (uint)fVar12 |
                           local_58._4_4_ & -(uint)(fVar12 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar6->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_68.x <= (float)local_58._0_4_) {
            fVar2 = local_68.x;
          }
          if ((fVar2 < (pIVar6->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_68.x <= (float)local_58._0_4_) & (uint)local_68.x |
                             local_58._0_4_ & -(uint)(local_68.x <= (float)local_58._0_4_)),
             (pIVar6->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar6->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_68,col,line_weight);
          }
        }
        local_58._0_4_ = local_68.x;
        local_58._4_4_ = local_68.y;
        iVar11 = iVar11 + 1;
        iVar10 = getter->Count;
      } while (iVar11 < iVar10);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}